

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_str_pad(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *zString;
  char *local_58;
  char *zPad;
  char *zIn;
  int jPad;
  int iRealPad;
  int iStrpad;
  int iDiv;
  int i;
  int iType;
  int iPadlen;
  int iLen;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  _iPadlen = apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 2) {
    jx9_result_string(pCtx,"",0);
  }
  else {
    zString = jx9_value_to_string(*apArg,&iType);
    iVar2 = jx9_value_to_int(_iPadlen[1]);
    i = iVar2;
    if (0 < iVar2) {
      i = iVar2 - iType;
    }
    if (i < 1) {
      jx9_result_string(pjStack_18,zString,iType);
    }
    else {
      local_58 = " ";
      jPad = 1;
      iDiv = 1;
      if (2 < apArg_local._4_4_) {
        local_58 = jx9_value_to_string(_iPadlen[2],&jPad);
        if (jPad < 1) {
          local_58 = " ";
          jPad = 1;
        }
        if (((3 < apArg_local._4_4_) && (iDiv = jx9_value_to_int(_iPadlen[3]), iDiv != 0)) &&
           (iDiv != 2)) {
          iDiv = 1;
        }
      }
      iVar1 = jPad;
      iRealPad = 1;
      if (iDiv == 2) {
        iRealPad = 2;
      }
      if ((iDiv == 0) || (iDiv == 2)) {
        iStrpad = 0;
        while ((iStrpad < i / iRealPad &&
               (uVar3 = jx9_context_result_buf_length(pjStack_18),
               (int)(uVar3 + iType + iVar1) < iVar2))) {
          jx9_result_string(pjStack_18,local_58,iVar1);
          iStrpad = iVar1 + iStrpad;
        }
        if (iDiv == 0) {
          while (uVar3 = jx9_context_result_buf_length(pjStack_18), iVar1 = iType,
                (int)(uVar3 + iType) < iVar2) {
            uVar3 = jx9_context_result_buf_length(pjStack_18);
            zIn._0_4_ = iVar2 - (iVar1 + uVar3);
            if (jPad < (int)zIn) {
              zIn._0_4_ = jPad;
            }
            if ((int)zIn < 1) break;
            jx9_result_string(pjStack_18,local_58,(int)zIn);
          }
        }
      }
      if (0 < iType) {
        jx9_result_string(pjStack_18,zString,iType);
      }
      if ((iDiv == 1) || (iDiv == 2)) {
        iStrpad = 0;
        while ((iStrpad < i / iRealPad &&
               (uVar3 = jx9_context_result_buf_length(pjStack_18), (int)(uVar3 + jPad) < iVar2))) {
          jx9_result_string(pjStack_18,local_58,jPad);
          iStrpad = jPad + iStrpad;
        }
        while (uVar3 = jx9_context_result_buf_length(pjStack_18), (int)uVar3 < iVar2) {
          uVar3 = jx9_context_result_buf_length(pjStack_18);
          zIn._0_4_ = iVar2 - uVar3;
          if (jPad < (int)zIn) {
            zIn._0_4_ = jPad;
          }
          if ((int)zIn < 1) {
            return 0;
          }
          jx9_result_string(pjStack_18,local_58,(int)zIn);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_str_pad(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int iLen, iPadlen, iType, i, iDiv, iStrpad, iRealPad, jPad;
	const char *zIn, *zPad;
	if( nArg < 2 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &iLen);
	/* Padding length */
	iRealPad = iPadlen = jx9_value_to_int(apArg[1]);
	if( iPadlen > 0 ){
		iPadlen -= iLen;
	}
	if( iPadlen < 1  ){
		/* Return the string verbatim */
		jx9_result_string(pCtx, zIn, iLen);
		return JX9_OK;
	}
	zPad = " "; /* Whitespace padding */
	iStrpad = (int)sizeof(char);
	iType = 1 ; /* STR_PAD_RIGHT */
	if( nArg > 2 ){
		/* Padding string */
		zPad = jx9_value_to_string(apArg[2], &iStrpad);
		if( iStrpad < 1 ){
			/* Empty string */
			zPad = " "; /* Whitespace padding */
			iStrpad = (int)sizeof(char);
		}
		if( nArg > 3 ){
			/* Padd type */
			iType = jx9_value_to_int(apArg[3]);
			if( iType != 0 /* STR_PAD_LEFT */ && iType != 2 /* STR_PAD_BOTH */ ){
				iType = 1 ; /* STR_PAD_RIGHT */
			}
		}
	}
	iDiv = 1;
	if( iType == 2 ){
		iDiv = 2; /* STR_PAD_BOTH */
	}
	/* Perform the requested operation */
	if( iType == 0 /* STR_PAD_LEFT */ || iType == 2 /* STR_PAD_BOTH */ ){
		jPad = iStrpad;
		for( i = 0 ; i < iPadlen/iDiv ; i += jPad ){
			/* Padding */
			if( (int)jx9_context_result_buf_length(pCtx) + iLen + jPad >= iRealPad ){
				break;
			}
			jx9_result_string(pCtx, zPad, jPad);
		}
		if( iType == 0 /* STR_PAD_LEFT */ ){
			while( (int)jx9_context_result_buf_length(pCtx) + iLen < iRealPad ){
				jPad = iRealPad - (iLen + (int)jx9_context_result_buf_length(pCtx) );
				if( jPad > iStrpad ){
					jPad = iStrpad;
				}
				if( jPad < 1){
					break;
				}
				jx9_result_string(pCtx, zPad, jPad);
			}
		}
	}
	if( iLen > 0 ){
		/* Append the input string */
		jx9_result_string(pCtx, zIn, iLen);
	}
	if( iType == 1 /* STR_PAD_RIGHT */ || iType == 2 /* STR_PAD_BOTH */ ){
		for( i = 0 ; i < iPadlen/iDiv ; i += iStrpad ){
			/* Padding */
			if( (int)jx9_context_result_buf_length(pCtx) + iStrpad >= iRealPad ){
				break;
			}
			jx9_result_string(pCtx, zPad, iStrpad);
		}
		while( (int)jx9_context_result_buf_length(pCtx) < iRealPad ){
			jPad = iRealPad - (int)jx9_context_result_buf_length(pCtx);
			if( jPad > iStrpad ){
				jPad = iStrpad;
			}
			if( jPad < 1){
				break;
			}
			jx9_result_string(pCtx, zPad, jPad);
		}
	}
	return JX9_OK;
}